

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O0

void __thiscall PrintActionsLog::act(PrintActionsLog *this,Restaurant *restaurant)

{
  bool bVar1;
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> *__x;
  reference ppBVar2;
  ostream *poVar3;
  string local_70 [32];
  BaseAction *local_50;
  BaseAction *i;
  iterator __end1;
  iterator __begin1;
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> *__range1;
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> res;
  Restaurant *restaurant_local;
  PrintActionsLog *this_local;
  
  res.super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)restaurant;
  __x = Restaurant::getActionsLog(restaurant);
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::vector
            ((vector<BaseAction_*,_std::allocator<BaseAction_*>_> *)&__range1,__x);
  __end1 = std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::begin
                     ((vector<BaseAction_*,_std::allocator<BaseAction_*>_> *)&__range1);
  i = (BaseAction *)
      std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::end
                ((vector<BaseAction_*,_std::allocator<BaseAction_*>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<BaseAction_**,_std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<BaseAction_**,_std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>_>
              ::operator*(&__end1);
    local_50 = *ppBVar2;
    (*local_50->_vptr_BaseAction[1])(local_70);
    poVar3 = std::operator<<((ostream *)&std::cout,local_70);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<BaseAction_**,_std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>_>::
    operator++(&__end1);
  }
  BaseAction::complete(&this->super_BaseAction);
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::~vector
            ((vector<BaseAction_*,_std::allocator<BaseAction_*>_> *)&__range1);
  return;
}

Assistant:

void PrintActionsLog::act(Restaurant &restaurant)
{
    std::vector<BaseAction*>res = restaurant.getActionsLog();
    for (auto i : res)
    {
        std::cout << i->toString() << "\n" ;
    }
    complete();
}